

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffpxsz(int datatype)

{
  undefined4 local_c;
  int datatype_local;
  
  if (datatype == 0xb) {
    local_c = 1;
  }
  else if (datatype == 0x14) {
    local_c = 2;
  }
  else if (datatype == 0x15) {
    local_c = 2;
  }
  else if (datatype == 0x28) {
    local_c = 8;
  }
  else if (datatype == 0x29) {
    local_c = 8;
  }
  else if (datatype == 0x1f) {
    local_c = 4;
  }
  else if (datatype == 0x1e) {
    local_c = 4;
  }
  else if (datatype == 0x2a) {
    local_c = 4;
  }
  else if (datatype == 0x52) {
    local_c = 8;
  }
  else if (datatype == 0xe) {
    local_c = 1;
  }
  else {
    local_c = 0;
  }
  return local_c;
}

Assistant:

int ffpxsz(int datatype)
/*
   return the number of bytes per pixel associated with the datatype
*/
{
    if (datatype == TBYTE)
       return(sizeof(char));
    else if (datatype == TUSHORT)
       return(sizeof(short));
    else if (datatype == TSHORT)
       return(sizeof(short));
    else if (datatype == TULONG)
       return(sizeof(long));
    else if (datatype == TLONG)
       return(sizeof(long));
    else if (datatype == TINT)
       return(sizeof(int));
    else if (datatype == TUINT)
       return(sizeof(int));
    else if (datatype == TFLOAT)
       return(sizeof(float));
    else if (datatype == TDOUBLE)
       return(sizeof(double));
    else if (datatype == TLOGICAL)
       return(sizeof(char));
    else
       return(0);
}